

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::QueueInsertMethod::eval
          (QueueInsertMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  SourceRange range;
  bool bVar1;
  SourceLocation SVar2;
  SourceLocation diag;
  EvalContext *this_00;
  _Optional_payload_base<int> __position;
  int *piVar3;
  value_type *__x;
  size_type sVar4;
  reference ppEVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  optional<int> index;
  SVQueue *q;
  ConstantValue *target;
  ConstantValue cv;
  ConstantValue ci;
  LValue lval;
  ConstantValue *in_stack_fffffffffffffca8;
  deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *this_01;
  EvalContext *in_stack_fffffffffffffcb0;
  SVQueue *this_02;
  Expression *in_stack_fffffffffffffcb8;
  SVQueue *__x_00;
  Diagnostic *in_stack_fffffffffffffcc0;
  LValue *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffd14;
  undefined4 uVar6;
  DiagCode code;
  undefined1 local_2b8 [64];
  _Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>
  local_278 [32];
  SourceLocation local_258;
  SourceLocation SStack_250;
  undefined4 local_23c;
  _Optional_payload_base<int> local_238;
  SVQueue *local_230;
  SourceLocation local_228;
  undefined4 local_21c;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  
  local_30 = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,1);
  Expression::eval(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,2);
  Expression::eval(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0x75027a);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd14);
  if (bVar1) {
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x750297);
    uVar6 = CONCAT13((char)((uint)uVar6 >> 0x18),CONCAT12(bVar1,(short)uVar6));
    if (bVar1) {
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x7502b4);
      code.code = (uint16_t)((uint)uVar6 >> 0x10);
      code.subsystem._0_1_ = (undefined1)uVar6;
      code.subsystem._1_1_ = bVar1;
      if (bVar1) {
        SVar2 = (SourceLocation)LValue::resolve(in_stack_fffffffffffffcc8);
        local_228 = SVar2;
        diag = (SourceLocation)slang::ConstantValue::queue((ConstantValue *)0x75036e);
        local_230 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x75037f);
        this_00 = (EvalContext *)slang::ConstantValue::integer((ConstantValue *)0x750394);
        __position = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)in_stack_fffffffffffffcc8)
        ;
        local_238 = __position;
        bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x7503c6);
        if ((bVar1) &&
           (piVar3 = std::optional<int>::operator*((optional<int> *)0x7503d9), -1 < *piVar3)) {
          piVar3 = std::optional<int>::operator*((optional<int> *)0x7503eb);
          __x = (value_type *)(long)*piVar3;
          sVar4 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                            ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                             0x750400);
          if (__x < (value_type *)(sVar4 + 1)) {
            this_01 = (deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                      local_2b8;
            __x_00 = local_230;
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin(this_01);
            std::optional<int>::operator*((optional<int> *)0x75052a);
            this_02 = (SVQueue *)(local_2b8 + 0x20);
            std::operator+((_Self *)__x_00,(difference_type)this_02);
            std::
            _Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>
            ::
            _Deque_iterator<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
                      (local_278,
                       (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                        *)this_02);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)this_00
                       ,(const_iterator *)__position,__x);
            SVQueue::resizeToBound(this_02);
            slang::ConstantValue::ConstantValue((ConstantValue *)this_02,this_01);
            goto LAB_007505a5;
          }
        }
        local_23c = 0x23000c;
        ppEVar5 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (local_30,1);
        local_258 = ((*ppEVar5)->sourceRange).startLoc;
        SStack_250 = ((*ppEVar5)->sourceRange).endLoc;
        range.endLoc = SVar2;
        range.startLoc = diag;
        EvalContext::addDiag(this_00,code,range);
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                  (local_30,0);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x7504ac);
        ast::operator<<((Diagnostic *)diag,(Type *)this_00);
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                  ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)0x7504cd);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffffcc0,(unsigned_long)in_stack_fffffffffffffcb8);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        goto LAB_007505a5;
      }
    }
  }
  slang::ConstantValue::ConstantValue
            ((ConstantValue *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
LAB_007505a5:
  local_21c = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x7505b2);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x7505bf);
  LValue::~LValue((LValue *)0x7505cc);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        auto ci = args[1]->eval(context);
        auto cv = args[2]->eval(context);
        if (!lval || !ci || !cv)
            return nullptr;

        auto target = lval.resolve();
        SLANG_ASSERT(target && target->isQueue());

        auto& q = *target->queue();
        std::optional<int32_t> index = ci.integer().as<int32_t>();
        if (!index || *index < 0 || size_t(*index) >= q.size() + 1) {
            context.addDiag(diag::ConstEvalDynamicArrayIndex, args[1]->sourceRange)
                << ci << *args[0]->type << q.size() + 1;
            return nullptr;
        }

        q.insert(q.begin() + *index, std::move(cv));
        q.resizeToBound();
        return nullptr;
    }